

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GC.cpp
# Opt level: O3

Closure * __thiscall luna::GC::NewClosure(GC *this,GCGeneration gen)

{
  Closure *this_00;
  
  this_00 = (Closure *)operator_new(0x38);
  Closure::Closure(this_00);
  (this_00->super_GCObject).field_0x10 = (this_00->super_GCObject).field_0x10 & 0xf | 0x30;
  SetObjectGen(this,(GCObject *)this_00,gen);
  return this_00;
}

Assistant:

Closure * GC::NewClosure(GCGeneration gen)
    {
        auto c = new Closure;
        c->gc_obj_type_ = GCObjectType_Closure;
        SetObjectGen(c, gen);
        return c;
    }